

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

int lj_ir_numcmp(lua_Number a,lua_Number b,IROp op)

{
  bool bVar1;
  
  switch(op) {
  case IR_LT:
    bVar1 = b < a;
    goto LAB_00150623;
  case IR_GE:
    bVar1 = a < b;
    goto LAB_00150635;
  case IR_LE:
    bVar1 = b < a;
LAB_00150635:
    bVar1 = !bVar1;
    break;
  case IR_GT:
    bVar1 = a < b;
LAB_00150623:
    bVar1 = !bVar1 && a != b;
    break;
  case IR_ULT:
    bVar1 = a < b;
    break;
  case IR_UGE:
    bVar1 = b < a;
    goto LAB_00150644;
  case IR_ULE:
    bVar1 = a < b;
LAB_00150644:
    bVar1 = bVar1 || a == b;
    break;
  case IR_UGT:
    bVar1 = b < a;
    break;
  case IR_EQ:
    bVar1 = a == b;
    goto LAB_00150652;
  case IR_NE:
    bVar1 = a != b;
LAB_00150652:
    bVar1 = (bool)(-bVar1 & 1);
    break;
  default:
    bVar1 = false;
  }
  return (int)bVar1;
}

Assistant:

int lj_ir_numcmp(lua_Number a, lua_Number b, IROp op)
{
  switch (op) {
  case IR_EQ: return (a == b);
  case IR_NE: return (a != b);
  case IR_LT: return (a < b);
  case IR_GE: return (a >= b);
  case IR_LE: return (a <= b);
  case IR_GT: return (a > b);
  case IR_ULT: return !(a >= b);
  case IR_UGE: return !(a < b);
  case IR_ULE: return !(a > b);
  case IR_UGT: return !(a <= b);
  default: lj_assertX(0, "bad IR op %d", op); return 0;
  }
}